

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

TypeFunction *
GetFunctionTypeFromCache
          (DirectChainedMap<TypeFunction_*> *table,uint hash,TypeBase *returnType,
          ArrayView<ArgumentData> arguments)

{
  TypeFunction *pTVar1;
  Node *start;
  Node *pNVar2;
  Node *pNVar3;
  Node *pNVar4;
  uint uVar5;
  TypeHandle *pTVar6;
  ulong uVar7;
  TypeBase **ppTVar8;
  bool bVar9;
  NodeIterator NVar10;
  
  NVar10 = DirectChainedMap<TypeFunction_*>::first(table,hash);
  if (NVar10.node != (Node *)0x0) {
    uVar5 = arguments.count;
    do {
      pNVar4 = NVar10.node;
      pNVar2 = NVar10.start;
      pTVar1 = *(TypeFunction **)(pNVar4 + 8);
      if (pTVar1->returnType == returnType) {
        pTVar6 = (pTVar1->arguments).head;
        bVar9 = uVar5 != 0;
        if ((uVar5 != 0) && (pTVar6 != (TypeHandle *)0x0)) {
          uVar7 = 1;
          ppTVar8 = &(arguments.data)->type;
          do {
            if (pTVar6->type != *ppTVar8) goto LAB_001d8f9a;
            pTVar6 = pTVar6->next;
            bVar9 = uVar7 < (arguments._8_8_ & 0xffffffff);
            if (!bVar9) break;
            ppTVar8 = ppTVar8 + 6;
            uVar7 = uVar7 + 1;
          } while (pTVar6 != (TypeHandle *)0x0);
        }
        if ((!bVar9) && (pTVar6 == (TypeHandle *)0x0)) {
          return pTVar1;
        }
LAB_001d8f9a:
        pNVar3 = *(Node **)(pNVar4 + 0x10);
        if (pNVar3 != pNVar2) {
          do {
            if (pNVar3 == (Node *)0x0) break;
            if (*(int *)pNVar3 == *(int *)pNVar4) goto LAB_001d8fbb;
            pNVar3 = *(Node **)(pNVar3 + 0x10);
          } while (pNVar3 != pNVar2);
        }
      }
      else {
        pNVar3 = *(Node **)(pNVar4 + 0x10);
        if (pNVar3 != pNVar2) {
          do {
            if (pNVar3 == (Node *)0x0) break;
            if (*(int *)pNVar3 == *(int *)pNVar4) goto LAB_001d8fbb;
            pNVar3 = *(Node **)(pNVar3 + 0x10);
          } while (pNVar3 != pNVar2);
        }
      }
      pNVar3 = (Node *)0x0;
      pNVar2 = (Node *)0x0;
LAB_001d8fbb:
      NVar10.node = pNVar3;
      NVar10.start = pNVar2;
    } while (pNVar3 != (Node *)0x0);
  }
  return (TypeFunction *)0x0;
}

Assistant:

TypeFunction* GetFunctionTypeFromCache(DirectChainedMap<TypeFunction*> &table, unsigned hash, TypeBase* returnType, ArrayView<ArgumentData> arguments)
{
	typedef DirectChainedMap<TypeFunction*>::NodeIterator Node;

	if(Node curr = table.first(hash))
	{
		while(curr)
		{
			TypeFunction *type = curr.node->value;

			if(type->returnType != returnType)
			{
				curr = table.next(curr);
				continue;
			}

			TypeHandle *leftArg = type->arguments.head;

			bool match = true;

			for(unsigned i = 0; i < arguments.size(); i++)
			{
				if(!leftArg || leftArg->type != arguments[i].type)
				{
					match = false;
					break;
				}

				leftArg = leftArg->next;
			}

			if(!match || leftArg)
			{
				curr = table.next(curr);
				continue;
			}

			return type;
		}
	}

	return NULL;
}